

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext.cc
# Opt level: O2

void __thiscall fasttext::FastText::loadVectors(FastText *this,string *filename)

{
  element_type *peVar1;
  char cVar2;
  int32_t iVar3;
  uint uVar4;
  istream *piVar5;
  ostream *poVar6;
  int64_t iVar7;
  size_t j;
  ulong uVar8;
  long lVar9;
  long lVar10;
  size_t i;
  ulong uVar11;
  long lVar12;
  bool bVar13;
  int64_t dim;
  int64_t n;
  shared_ptr<fasttext::Matrix> mat;
  string word;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  words;
  int local_23c;
  ifstream in;
  
  std::ifstream::ifstream(&in,(string *)filename,_S_in);
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  words.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  mat.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)0x0;
  mat.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  cVar2 = std::__basic_file<char>::is_open();
  if (cVar2 == '\0') {
    poVar6 = std::operator<<((ostream *)&std::cerr,"Pretrained vectors file cannot be opened!");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  else {
    piVar5 = std::istream::_M_extract<long>((long *)&in);
    std::istream::_M_extract<long>((long *)piVar5);
    poVar6 = std::operator<<((ostream *)&std::cout,"Types:");
    poVar6 = std::ostream::_M_insert<long>((long)poVar6);
    poVar6 = std::operator<<(poVar6,"dim:");
    std::ostream::_M_insert<long>((long)poVar6);
    if (dim == ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
               ->dim) {
      std::make_shared<fasttext::Matrix,long&,long&>((long *)&word,&n);
      std::__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&mat.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> *)&word);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&word._M_string_length);
      for (uVar11 = 0; uVar11 < (ulong)n; uVar11 = uVar11 + 1) {
        word._M_dataplus._M_p = (pointer)&word.field_2;
        word._M_string_length = 0;
        word.field_2._M_local_buf[0] = '\0';
        std::operator>>((istream *)&in,(string *)&word);
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::push_back(&words,&word);
        for (uVar8 = 0; uVar8 < (ulong)dim; uVar8 = uVar8 + 1) {
          std::istream::_M_extract<float>((float *)&in);
        }
        std::__cxx11::string::~string((string *)&word);
      }
      std::ifstream::close();
      iVar3 = Dictionary::nwords((this->dict_).
                                 super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr);
      local_23c = iVar3 + ((this->args_).
                           super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          bucket;
      std::make_shared<fasttext::Matrix,int,int&>((int *)&word,&local_23c);
      std::__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&(this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>,
                 (__shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2> *)&word);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&word._M_string_length);
      Matrix::uniform((this->input_).
                      super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
                      1.0 / (float)((this->args_).
                                    super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                                   _M_ptr)->dim);
      lVar12 = 0;
      for (uVar11 = 0; uVar11 < (ulong)n; uVar11 = uVar11 + 1) {
        uVar4 = Dictionary::getHash((this->dict_).
                                    super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                    ._M_ptr,words.
                                            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start + uVar11);
        if (-1 < (int)uVar4) {
          iVar3 = Dictionary::nwords((this->dict_).
                                     super___shared_ptr<fasttext::Dictionary,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr);
          if ((int)uVar4 <
              iVar3 + ((this->args_).super___shared_ptr<fasttext::Args,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr)->bucket) {
            peVar1 = (this->input_).super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr;
            lVar9 = (ulong)uVar4 * dim;
            lVar10 = dim * lVar12;
            iVar7 = dim;
            while (bVar13 = iVar7 != 0, iVar7 = iVar7 + -1, bVar13) {
              peVar1->data_[lVar9] =
                   *(real *)((long)(mat.
                                    super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->data_ + lVar10);
              lVar9 = lVar9 + 1;
              lVar10 = lVar10 + 4;
            }
          }
        }
        lVar12 = lVar12 + 4;
      }
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&mat.super___shared_ptr<fasttext::Matrix,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector(&words);
      std::ifstream::~ifstream(&in);
      return;
    }
    poVar6 = std::operator<<((ostream *)&std::cerr,
                             "Dimension of pretrained vectors does not match -dim option");
    std::endl<char,std::char_traits<char>>(poVar6);
  }
  exit(1);
}

Assistant:

void FastText::loadVectors(std::string filename) {
  std::ifstream in(filename);
  std::vector<std::string> words;
  std::shared_ptr<Matrix> mat; // temp. matrix for pretrained vectors
  int64_t n, dim;
  if (!in.is_open()) {
    std::cerr << "Pretrained vectors file cannot be opened!" << std::endl;
    exit(EXIT_FAILURE);
  }
  in >> n >> dim;
  std::cout << "Types:" << n << "dim:" << dim;
  if (dim != args_->dim) {
    std::cerr << "Dimension of pretrained vectors does not match -dim option"
              << std::endl;
    exit(EXIT_FAILURE);
  }
  mat = std::make_shared<Matrix>(n, dim);
  for (size_t i = 0; i < n; i++) {
    std::string word;
    in >> word;
    words.push_back(word);
    //dict_->add("",word);
    for (size_t j = 0; j < dim; j++) {
      in >> mat->data_[i * dim + j];
    }
  }
  in.close();

  //dict_->threshold(1);
  input_ = std::make_shared<Matrix>(dict_->nwords()+args_->bucket, args_->dim);
  input_->uniform(1.0 / args_->dim);

  for (size_t i = 0; i < n; i++) {
    int32_t idx = dict_->getHash(words[i]);
    if (idx < 0 || idx >= dict_->nwords() + args_->bucket) continue;
    for (size_t j = 0; j < dim; j++) {
      input_->data_[idx * dim + j] = mat->data_[i * dim + j];
    }
  }
}